

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standardsurface.h
# Opt level: O0

bool __thiscall
rengine::StandardSurface::deliverPointerEventInScene
          (StandardSurface *this,Node *node,PointerEvent *e)

{
  bool bVar1;
  int iVar2;
  RectangleNodeBase *this_00;
  pointer this_01;
  Node *root;
  vec2 vVar3;
  byte local_101;
  mat4 local_d4;
  undefined1 local_90 [8];
  mat4 nodeInvMatrix;
  bool inv;
  rect2d area;
  RectangleNodeBase *rectNode;
  Node *child;
  PointerEvent *e_local;
  Node *node_local;
  StandardSurface *this_local;
  
  if (node == (Node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/standardsurface.h"
                  ,0xa1,
                  "bool rengine::StandardSurface::deliverPointerEventInScene(Node *, PointerEvent *)"
                 );
  }
  if (e != (PointerEvent *)0x0) {
    for (rectNode = (RectangleNodeBase *)Node::lastChild(node); rectNode != (RectangleNodeBase *)0x0
        ; rectNode = (RectangleNodeBase *)Node::previousSibling((Node *)rectNode)) {
      bVar1 = deliverPointerEventInScene(this,(Node *)rectNode,e);
      if (bVar1) {
        return true;
      }
    }
    bVar1 = Node::isPointerTarget(node);
    if ((bVar1) && (this_00 = RectangleNodeBase::from(node), this_00 != (RectangleNodeBase *)0x0)) {
      join_0x00001240_0x00001200_ = RectangleNodeBase::geometry(this_00);
      nodeInvMatrix.m[0xf]._3_1_ = 0;
      this_01 = std::unique_ptr<rengine::Renderer,_std::default_delete<rengine::Renderer>_>::
                operator->(&this->m_renderer);
      root = Renderer::sceneRoot(this_01);
      TransformNode::matrixFor(&local_d4,node,root);
      mat4::inverted((mat4 *)local_90,&local_d4,(bool *)((long)nodeInvMatrix.m + 0x3f));
      if ((nodeInvMatrix.m[0xf]._3_1_ & 1) != 0) {
        vVar3 = PointerEvent::positionInSurface(e);
        vVar3 = mat4::operator*((mat4 *)local_90,vVar3);
        PointerEvent::setPosition(e,vVar3);
        vVar3 = PointerEvent::position(e);
        bVar1 = rect2d::contains((rect2d *)&nodeInvMatrix.type,vVar3);
        local_101 = 0;
        if (bVar1) {
          iVar2 = (*(node->super_SignalEmitter)._vptr_SignalEmitter[3])(node,e);
          local_101 = (byte)iVar2;
        }
        if ((local_101 & 1) != 0) {
          return true;
        }
      }
    }
    return false;
  }
  __assert_fail("e",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/standardsurface.h"
                ,0xa2,
                "bool rengine::StandardSurface::deliverPointerEventInScene(Node *, PointerEvent *)")
  ;
}

Assistant:

inline bool StandardSurface::deliverPointerEventInScene(Node *node, PointerEvent *e)
{
    assert(node);
    assert(e);

    // Traverse children in backwards order (and bottom up), so we get
    // inverse-paint order delivery
    Node *child = node->lastChild();
    while (child) {
        if (deliverPointerEventInScene(child, e))
            return true;
        child = child->previousSibling();
    }
    if (node->isPointerTarget()) {
        RectangleNodeBase *rectNode = RectangleNodeBase::from(node);
        if (rectNode) {
            rect2d area = rectNode->geometry();
            bool inv = false;
            mat4 nodeInvMatrix = TransformNode::matrixFor(node, m_renderer->sceneRoot()).inverted(&inv);

            // can only be inside if the matrix is invertible, as otherwise
            // the node will be "collapsed" in some dimension
            if (inv) {
                // Note that this doesn't bother to unset the position afterwards as
                // we will either:
                // 1. accept it and the value is correct
                // 2. reject it and the value will be written next time we try..
                e->setPosition(nodeInvMatrix * e->positionInSurface());
                if (area.contains(e->position()) && node->onPointerEvent(e))
                    return true;
            }
        }
    }

    return false;
}